

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Internal::try_to_eliminate_variable
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  Clause **ppCVar11;
  int iVar12;
  size_t sVar13;
  uint lit;
  pair<CaDiCaL::Clause_**,_long> pVar14;
  
  lit = -pivot;
  uVar7 = (ulong)(uint)pivot;
  if (pivot < 1) {
    uVar7 = (ulong)lit;
  }
  if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7] & 0x7000000) == 0x1000000) {
    sVar8 = flush_occs(this,pivot);
    sVar9 = flush_occs(this,lit);
    sVar13 = sVar9;
    if ((long)sVar8 < (long)sVar9) {
      sVar13 = sVar8;
    }
    if ((long)sVar8 <= (long)sVar9) {
      lit = pivot;
      sVar8 = sVar9;
    }
    if ((sVar13 == 0) || ((long)sVar8 <= (long)(this->opts).elimocclim)) {
      uVar5 = -pivot;
      if (0 < pivot) {
        uVar5 = pivot;
      }
      uVar6 = uVar5 << 1 | lit >> 0x1f;
      pvVar1 = (this->otab).
               super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = pvVar1[uVar6].
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = *(pointer *)
                 ((long)&pvVar1[uVar6].
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                         _M_impl.super__Vector_impl_data + 8);
      if (ppCVar2 != ppCVar3) {
        lVar10 = (long)ppCVar3 - (long)ppCVar2 >> 3;
        pVar14 = std::get_temporary_buffer<CaDiCaL::Clause*>
                           ((lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
        lVar10 = pVar14.second;
        ppCVar11 = pVar14.first;
        if (ppCVar11 == (Clause **)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar2,ppCVar3);
          lVar10 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar2,ppCVar3,ppCVar11,lVar10);
        }
        operator_delete(ppCVar11,lVar10 << 3);
      }
      iVar12 = -pivot;
      if (0 < pivot) {
        iVar12 = pivot;
      }
      uVar6 = iVar12 << 1 | -lit >> 0x1f;
      pvVar1 = (this->otab).
               super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = pvVar1[uVar6].
                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = *(pointer *)
                 ((long)&pvVar1[uVar6].
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                         _M_impl.super__Vector_impl_data + 8);
      if (ppCVar2 != ppCVar3) {
        lVar10 = (long)ppCVar3 - (long)ppCVar2 >> 3;
        pVar14 = std::get_temporary_buffer<CaDiCaL::Clause*>
                           ((lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
        lVar10 = pVar14.second;
        ppCVar11 = pVar14.first;
        if (ppCVar11 == (Clause **)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar2,ppCVar3);
          lVar10 = 0;
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                    (ppCVar2,ppCVar3,ppCVar11,lVar10);
        }
        operator_delete(ppCVar11,lVar10 << 3);
      }
      if (sVar13 != 0) {
        find_gate_clauses(this,eliminator,lit);
      }
      if (((this->unsat == false) && (this->vals[(int)lit] == '\0')) &&
         (bVar4 = elim_resolvents_are_bounded(this,eliminator,lit), bVar4)) {
        elim_add_resolvents(this,eliminator,lit);
        if (this->unsat == false) {
          mark_eliminated_clauses_as_garbage(this,eliminator,lit,deleted_binary_clause);
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5] & 0x7000000) == 0x1000000) {
          mark_eliminated(this,lit);
        }
      }
      unmark_gate_clauses(this,eliminator);
      elim_backward_clauses(this,eliminator);
      return;
    }
  }
  return;
}

Assistant:

void Internal::try_to_eliminate_variable (Eliminator &eliminator, int pivot,
                                          bool &deleted_binary_clause) {

  if (!active (pivot))
    return;
  assert (!frozen (pivot));

  // First flush garbage clauses.
  //
  int64_t pos = flush_occs (pivot);
  int64_t neg = flush_occs (-pivot);

  if (pos > neg) {
    pivot = -pivot;
    swap (pos, neg);
  }
  LOG ("pivot %d occurs positively %" PRId64
       " times and negatively %" PRId64 " times",
       pivot, pos, neg);
  assert (!eliminator.schedule.contains (abs (pivot)));
  assert (pos <= neg);

  if (pos && neg > opts.elimocclim) {
    LOG ("too many occurrences thus not eliminated %d", pivot);
    assert (!eliminator.schedule.contains (abs (pivot)));
    return;
  }

  LOG ("trying to eliminate %d", pivot);
  assert (!flags (pivot).eliminated ());

  // Sort occurrence lists, such that shorter clauses come first.
  Occs &ps = occs (pivot);
  stable_sort (ps.begin (), ps.end (), clause_smaller_size ());
  Occs &ns = occs (-pivot);
  stable_sort (ns.begin (), ns.end (), clause_smaller_size ());

  if (pos)
    find_gate_clauses (eliminator, pivot);

  if (!unsat && !val (pivot)) {
    if (elim_resolvents_are_bounded (eliminator, pivot)) {
      LOG ("number of resolvents on %d are bounded", pivot);
      elim_add_resolvents (eliminator, pivot);
      if (!unsat)
        mark_eliminated_clauses_as_garbage (eliminator, pivot,
                                            deleted_binary_clause);
      if (active (pivot))
        mark_eliminated (pivot);
    } else
      LOG ("too many resolvents on %d so not eliminated", pivot);
  }

  unmark_gate_clauses (eliminator);
  elim_backward_clauses (eliminator);
}